

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

string * __thiscall
QPDFWriter::getFinalVersion_abi_cxx11_(string *__return_storage_ptr__,QPDFWriter *this)

{
  element_type *peVar1;
  QPDFWriter *this_local;
  
  doWriteSetup(this);
  peVar1 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)&peVar1->final_pdf_version);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFWriter::getFinalVersion()
{
    doWriteSetup();
    return m->final_pdf_version;
}